

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibrary::BindReference(JavascriptLibrary *this,void *addr)

{
  WriteBarrierPtr<void> *pWVar1;
  code *pcVar2;
  Type *ptr;
  bool bVar3;
  WriteBarrierPtr<void> **ppWVar4;
  Recycler *pRVar5;
  void **ppvVar6;
  undefined4 *puVar7;
  WriteBarrierPtr<Memory::WriteBarrierPtr<void>_> local_60;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  WriteBarrierPtr<void> *local_20;
  Type *tmpBindRefChunk;
  void *addr_local;
  JavascriptLibrary *this_local;
  
  tmpBindRefChunk = (Type *)addr;
  addr_local = this;
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->bindRefChunkCurrent);
  pWVar1 = *ppWVar4;
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->bindRefChunkEnd);
  if (pWVar1 == *ppWVar4) {
    pRVar5 = this->recycler;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,2,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x1caa);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_48);
    local_58 = Memory::Recycler::AllocZero;
    local_50 = 0;
    local_20 = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                         ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocZero,0,2);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
              (&this->bindRefChunkEnd,local_20 + 1);
    ppvVar6 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&this->bindRefChunkBegin);
    pWVar1 = local_20;
    if (*ppvVar6 == (void *)0x0) {
      Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
                (&this->bindRefChunkCurrent,local_20);
      ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                          ((WriteBarrierPtr *)&this->bindRefChunkCurrent);
      Memory::WriteBarrierPtr<void>::operator=(&this->bindRefChunkBegin,*ppWVar4);
    }
    else {
      ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                          ((WriteBarrierPtr *)&this->bindRefChunkCurrent);
      Memory::WriteBarrierPtr<void>::operator=(*ppWVar4,pWVar1);
      Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator=
                (&this->bindRefChunkCurrent,local_20);
    }
  }
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->bindRefChunkCurrent);
  pWVar1 = *ppWVar4;
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->bindRefChunkEnd);
  if (*ppWVar4 < pWVar1 + 1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1cb8,"((bindRefChunkCurrent+1) <= bindRefChunkEnd)",
                                "(bindRefChunkCurrent+1) <= bindRefChunkEnd");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ptr = tmpBindRefChunk;
  ppWVar4 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)&this->bindRefChunkCurrent);
  Memory::WriteBarrierPtr<void>::operator=(*ppWVar4,ptr);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::operator++(&local_60,(int)this + 0x1940);
  return;
}

Assistant:

void JavascriptLibrary::BindReference(void * addr)
    {
        // The last void* is the linklist connecting to next block.
        if (bindRefChunkCurrent == bindRefChunkEnd)
        {
            Field(void*)* tmpBindRefChunk = RecyclerNewArrayZ(recycler,
                Field(void*), HeapConstants::ObjectGranularity / sizeof(void *));
            // reserve the last void* as the linklist node.
            bindRefChunkEnd = tmpBindRefChunk + (HeapConstants::ObjectGranularity / sizeof(void *) -1 );
            if (bindRefChunkBegin == nullptr)
            {
                bindRefChunkCurrent = tmpBindRefChunk;
                bindRefChunkBegin = bindRefChunkCurrent;
            }
            else
            {
                *bindRefChunkCurrent = tmpBindRefChunk;
                bindRefChunkCurrent = tmpBindRefChunk;
            }
        }
        Assert((bindRefChunkCurrent+1) <= bindRefChunkEnd);
        *bindRefChunkCurrent = addr;
        bindRefChunkCurrent++;
    }